

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceBound::~IfcFaceBound(IfcFaceBound *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined ***)((long)&this[-1].Orientation.field_2 + 8) = &PTR__IfcFaceBound_00875540;
  (this->Orientation)._M_dataplus._M_p = (pointer)&PTR__IfcFaceBound_008755b8;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcFaceBound_00875568;
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceBound_00875590;
  puVar1 = *(undefined1 **)
            &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18;
  puVar2 = &(this->super_IfcTopologicalRepresentationItem).field_0x28;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete((void *)((long)&this[-1].Orientation.field_2 + 8),0x70);
  return;
}

Assistant:

IfcFaceBound() : Object("IfcFaceBound") {}